

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst_debug_printf_pass.cpp
# Opt level: O2

Status __thiscall spvtools::opt::InstDebugPrintfPass::Process(InstDebugPrintfPass *this)

{
  Status SVar1;
  uint32_t uVar2;
  
  uVar2 = Module::GetExtInstImportId
                    ((((this->super_InstrumentPass).super_Pass.context_)->module_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                     .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,
                     "NonSemantic.DebugPrintf");
  *(uint32_t *)&(this->super_InstrumentPass).field_0x244 = uVar2;
  if (uVar2 == 0) {
    SVar1 = SuccessWithoutChange;
  }
  else {
    InitializeInstDebugPrintf(this);
    ProcessImpl(this);
    SVar1 = SuccessWithChange;
  }
  return SVar1;
}

Assistant:

Pass::Status InstDebugPrintfPass::Process() {
  ext_inst_printf_id_ =
      get_module()->GetExtInstImportId("NonSemantic.DebugPrintf");
  if (ext_inst_printf_id_ == 0) return Status::SuccessWithoutChange;
  InitializeInstDebugPrintf();
  return ProcessImpl();
}